

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_options<char>::basic_json_options(basic_json_options<char> *this)

{
  basic_json_options_common<char>::basic_json_options_common
            ((basic_json_options_common<char> *)
             &(this->super_basic_json_decode_options<char>).field_0x70);
  basic_json_decode_options<char>::basic_json_decode_options
            (&this->super_basic_json_decode_options<char>,&PTR_construction_vtable_24__00997a28);
  basic_json_encode_options<char>::basic_json_encode_options
            ((basic_json_encode_options<char> *)
             &(this->super_basic_json_decode_options<char>).field_0x30,
             &PTR_construction_vtable_24__00997a38);
  (this->super_basic_json_decode_options<char>)._vptr_basic_json_decode_options =
       (_func_int **)0x9979c0;
  *(undefined8 *)&(this->super_basic_json_decode_options<char>).field_0x70 = 0x997a10;
  *(undefined8 *)&(this->super_basic_json_decode_options<char>).field_0x30 = 0x9979e8;
  return;
}

Assistant:

basic_json_options() = default;